

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O3

QPropertyBindingData * __thiscall
QBindingStoragePrivate::get(QBindingStoragePrivate *this,QUntypedPropertyData *data,bool create)

{
  QBindingStorageData *pQVar1;
  ulong uVar2;
  QBindingStorageData *pQVar3;
  size_t newSize;
  QUntypedPropertyData *pQVar4;
  
  pQVar1 = *this->d;
  if (pQVar1 == (QBindingStorageData *)0x0) {
    newSize = 8;
    if (!create) {
      return (QPropertyBindingData *)0x0;
    }
  }
  else {
    if (pQVar1->used * 2 < pQVar1->size) goto LAB_002c12b7;
    newSize = pQVar1->size * 2;
  }
  reallocate(this,newSize);
LAB_002c12b7:
  uVar2 = ((ulong)data >> 0x20 ^ (ulong)data) * -0x2917014799a6026d;
  uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
  pQVar1 = *this->d;
  uVar2 = pQVar1->size - 1 & (uVar2 >> 0x20 ^ uVar2);
  pQVar4 = (QUntypedPropertyData *)pQVar1[uVar2 + 1].size;
  if (pQVar4 != (QUntypedPropertyData *)0x0) {
    do {
      if (pQVar4 == data) {
        return (QPropertyBindingData *)&pQVar1[uVar2 + 1].used;
      }
      uVar2 = uVar2 + 1;
      if (uVar2 == pQVar1->size) {
        uVar2 = 0;
      }
      pQVar4 = (QUntypedPropertyData *)pQVar1[uVar2 + 1].size;
    } while (pQVar4 != (QUntypedPropertyData *)0x0);
  }
  pQVar3 = pQVar1 + uVar2 + 1;
  if (!create) {
    return (QPropertyBindingData *)0x0;
  }
  pQVar1->used = pQVar1->used + 1;
  pQVar3->size = (size_t)data;
  pQVar3->used = 0;
  return (QPropertyBindingData *)&pQVar3->used;
}

Assistant:

QPropertyBindingData *get(QUntypedPropertyData *data, bool create)
    {
        if (!d) {
            if (!create)
                return nullptr;
            reallocate(8);
        }
        else if (d->used*2 >= d->size)
            reallocate(d->size*2);
        Q_ASSERT(d->size && (d->size & (d->size - 1)) == 0); // size is a power of two
        size_t index = qHash(data) & (d->size - 1);
        Pair *p = pairs(d);
        while (p[index].data) {
            if (p[index].data == data)
                return &p[index].bindingData;
            ++index;
            if (index == d->size)
                index = 0;
        }
        if (!create)
            return nullptr;
        ++d->used;
        new (p + index) Pair{data, QPropertyBindingData()};
        return &p[index].bindingData;
    }